

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

void __thiscall
cmComputeLinkInformation::AddUserItem(cmComputeLinkInformation *this,string *item,bool pathNotKnown)

{
  bool bVar1;
  char *pcVar2;
  long lVar3;
  Item local_130;
  undefined1 local_100 [8];
  string out;
  string local_c0;
  string local_a0;
  string local_80 [8];
  string lib;
  Item local_50;
  byte local_19;
  string *psStack_18;
  bool pathNotKnown_local;
  string *item_local;
  cmComputeLinkInformation *this_local;
  
  local_19 = pathNotKnown;
  psStack_18 = item;
  item_local = (string *)this;
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)item);
  if (((*pcVar2 == '-') ||
      (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)psStack_18), *pcVar2 == '$')) ||
     (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)psStack_18), *pcVar2 == '`')) {
    lVar3 = std::__cxx11::string::find((char *)psStack_18,0x99773e);
    if ((lVar3 == 0) ||
       (lVar3 = std::__cxx11::string::find((char *)psStack_18,0x99773a), lVar3 == 0)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->OldUserFlagItems,psStack_18);
    }
    SetCurrentLinkType(this,this->StartLinkType);
    Item::Item(&local_50,psStack_18,false,(cmGeneratorTarget *)0x0);
    std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>::
    push_back(&this->Items,&local_50);
    Item::~Item(&local_50);
  }
  else {
    std::__cxx11::string::string(local_80);
    bVar1 = cmsys::RegularExpression::find(&this->ExtractSharedLibraryName,psStack_18);
    if (bVar1) {
      SetCurrentLinkType(this,LinkShared);
      cmsys::RegularExpression::match_abi_cxx11_(&local_a0,&this->ExtractSharedLibraryName,2);
      std::__cxx11::string::operator=(local_80,(string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
    }
    else {
      bVar1 = cmsys::RegularExpression::find(&this->ExtractStaticLibraryName,psStack_18);
      if (bVar1) {
        SetCurrentLinkType(this,LinkStatic);
        cmsys::RegularExpression::match_abi_cxx11_(&local_c0,&this->ExtractStaticLibraryName,2);
        std::__cxx11::string::operator=(local_80,(string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_c0);
      }
      else {
        bVar1 = cmsys::RegularExpression::find(&this->ExtractAnyLibraryName,psStack_18);
        if (bVar1) {
          SetCurrentLinkType(this,this->StartLinkType);
          cmsys::RegularExpression::match_abi_cxx11_
                    ((string *)((long)&out.field_2 + 8),&this->ExtractAnyLibraryName,2);
          std::__cxx11::string::operator=(local_80,(string *)(out.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(out.field_2._M_local_buf + 8));
        }
        else {
          if ((local_19 & 1) != 0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&this->OldUserFlagItems,psStack_18);
          }
          SetCurrentLinkType(this,this->StartLinkType);
          std::__cxx11::string::operator=(local_80,(string *)psStack_18);
        }
      }
    }
    std::__cxx11::string::string((string *)local_100,(string *)&this->LibLinkFlag);
    std::__cxx11::string::operator+=((string *)local_100,local_80);
    std::__cxx11::string::operator+=((string *)local_100,(string *)&this->LibLinkSuffix);
    Item::Item(&local_130,(string *)local_100,false,(cmGeneratorTarget *)0x0);
    std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>::
    push_back(&this->Items,&local_130);
    Item::~Item(&local_130);
    std::__cxx11::string::~string((string *)local_100);
    std::__cxx11::string::~string(local_80);
  }
  return;
}

Assistant:

void cmComputeLinkInformation::AddUserItem(std::string const& item,
                                           bool pathNotKnown)
{
  // This is called to handle a link item that does not match a CMake
  // target and is not a full path.  We check here if it looks like a
  // library file name to automatically request the proper link type
  // from the linker.  For example:
  //
  //   foo       ==>  -lfoo
  //   libfoo.a  ==>  -Wl,-Bstatic -lfoo

  // Pass flags through untouched.
  if(item[0] == '-' || item[0] == '$' || item[0] == '`')
    {
    // if this is a -l option then we might need to warn about
    // CMP0003 so put it in OldUserFlagItems, if it is not a -l
    // or -Wl,-l (-framework -pthread), then allow it without a
    // CMP0003 as -L will not affect those other linker flags
    if(item.find("-l") == 0 ||  item.find("-Wl,-l") == 0)
      {
      // This is a linker option provided by the user.
      this->OldUserFlagItems.push_back(item);
      }

    // Restore the target link type since this item does not specify
    // one.
    this->SetCurrentLinkType(this->StartLinkType);

    // Use the item verbatim.
    this->Items.push_back(Item(item, false));
    return;
    }

  // Parse out the prefix, base, and suffix components of the
  // library name.  If the name matches that of a shared or static
  // library then set the link type accordingly.
  //
  // Search for shared library names first because some platforms
  // have shared libraries with names that match the static library
  // pattern.  For example cygwin and msys use the convention
  // libfoo.dll.a for import libraries and libfoo.a for static
  // libraries.  On AIX a library with the name libfoo.a can be
  // shared!
  std::string lib;
  if(this->ExtractSharedLibraryName.find(item))
    {
    // This matches a shared library file name.
#ifdef CM_COMPUTE_LINK_INFO_DEBUG
    fprintf(stderr, "shared regex matched [%s] [%s] [%s]\n",
            this->ExtractSharedLibraryName.match(1).c_str(),
            this->ExtractSharedLibraryName.match(2).c_str(),
            this->ExtractSharedLibraryName.match(3).c_str());
#endif
    // Set the link type to shared.
    this->SetCurrentLinkType(LinkShared);

    // Use just the library name so the linker will search.
    lib = this->ExtractSharedLibraryName.match(2);
    }
  else if(this->ExtractStaticLibraryName.find(item))
    {
    // This matches a static library file name.
#ifdef CM_COMPUTE_LINK_INFO_DEBUG
    fprintf(stderr, "static regex matched [%s] [%s] [%s]\n",
            this->ExtractStaticLibraryName.match(1).c_str(),
            this->ExtractStaticLibraryName.match(2).c_str(),
            this->ExtractStaticLibraryName.match(3).c_str());
#endif
    // Set the link type to static.
    this->SetCurrentLinkType(LinkStatic);

    // Use just the library name so the linker will search.
    lib = this->ExtractStaticLibraryName.match(2);
    }
  else if(this->ExtractAnyLibraryName.find(item))
    {
    // This matches a library file name.
#ifdef CM_COMPUTE_LINK_INFO_DEBUG
    fprintf(stderr, "any regex matched [%s] [%s] [%s]\n",
            this->ExtractAnyLibraryName.match(1).c_str(),
            this->ExtractAnyLibraryName.match(2).c_str(),
            this->ExtractAnyLibraryName.match(3).c_str());
#endif
    // Restore the target link type since this item does not specify
    // one.
    this->SetCurrentLinkType(this->StartLinkType);

    // Use just the library name so the linker will search.
    lib = this->ExtractAnyLibraryName.match(2);
    }
  else
    {
    // This is a name specified by the user.
    if(pathNotKnown)
      {
      this->OldUserFlagItems.push_back(item);
      }

    // We must ask the linker to search for a library with this name.
    // Restore the target link type since this item does not specify
    // one.
    this->SetCurrentLinkType(this->StartLinkType);
    lib = item;
    }

  // Create an option to ask the linker to search for the library.
  std::string out = this->LibLinkFlag;
  out += lib;
  out += this->LibLinkSuffix;
  this->Items.push_back(Item(out, false));

  // Here we could try to find the library the linker will find and
  // add a runtime information entry for it.  It would probably not be
  // reliable and we want to encourage use of full paths for library
  // specification.
}